

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalOpenMutex
                    (CPalThread *pthr,DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName,
                    HANDLE *phMutex)

{
  undefined1 local_48 [8];
  CPalString sObjectName;
  IPalObject *pobjMutex;
  PAL_ERROR palError;
  HANDLE *phMutex_local;
  LPCWSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  CPalThread *pthr_local;
  
  sObjectName.m_dwStringLength = 0;
  sObjectName.m_dwMaxLength = 0;
  CPalString::CPalString((CPalString *)local_48,lpName);
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x216);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (lpName == (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x217);
    fprintf(_stderr,"Expression: NULL != lpName\n");
  }
  if (phMutex == (HANDLE *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalOpenMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0x218);
    fprintf(_stderr,"Expression: NULL != phMutex\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    pobjMutex._4_4_ =
         (**(code **)(*g_pObjectManager + 0x10))
                   (g_pObjectManager,pthr,local_48,&aotMutex,&sObjectName.m_dwStringLength);
    if (pobjMutex._4_4_ == 0) {
      pobjMutex._4_4_ =
           (**(code **)(*g_pObjectManager + 0x18))
                     (g_pObjectManager,pthr,sObjectName._8_8_,dwDesiredAccess,bInheritHandle != 0,0,
                      phMutex);
    }
    if (sObjectName._8_8_ != 0) {
      (**(code **)(*(long *)sObjectName._8_8_ + 0x40))(sObjectName._8_8_,pthr);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return pobjMutex._4_4_;
    }
    abort();
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalOpenMutex(
    CPalThread *pthr,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    LPCWSTR lpName,
    HANDLE *phMutex
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjMutex = NULL;
    CPalString sObjectName(lpName);

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != lpName);
    _ASSERTE(NULL != phMutex);

    ENTRY("InternalOpenMutex(pthr=%p, dwDesiredAccess=%d, bInheritHandle=%d, "
        "lpName=%p, phMutex=%p)\n",
        pthr,
        dwDesiredAccess,
        bInheritHandle,
        lpName,
        phMutex
        );

    palError = g_pObjectManager->LocateObject(
        pthr,
        &sObjectName,
        &aotMutex,
        &pobjMutex
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenMutexExit;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pthr,
        pobjMutex,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phMutex
        );

    if (NO_ERROR != palError)
    {
        goto InternalOpenMutexExit;
    }

InternalOpenMutexExit:

    if (NULL != pobjMutex)
    {
        pobjMutex->ReleaseReference(pthr);
    }

    LOGEXIT("InternalOpenMutex returns %d\n", palError);

    return palError;
}